

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.c
# Opt level: O2

int test_json(test_scope *scope,char *json,char *expect,int expect_err,
             flatcc_json_parser_flags_t parse_flags,flatcc_json_printer_flags_t print_flags,int line
             )

{
  FILE *pFVar1;
  char cVar2;
  int iVar3;
  size_t bufsiz;
  void *buf;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  size_t flatbuffer_size;
  char *local_280;
  char local_278 [24];
  size_t buf_size;
  flatcc_json_printer_t printer_ctx;
  flatcc_json_parser_t parser_ctx;
  flatcc_builder_t builder;
  
  local_280 = expect;
  flatcc_builder_init(&builder);
  flatcc_json_printer_init_dynamic_buffer(&printer_ctx,0);
  printer_ctx._49_2_ = CONCAT11((char)print_flags,printer_ctx.indent) & 0x1ff;
  printer_ctx.noenum = (byte)(print_flags >> 1) & 1;
  printer_ctx.skip_default = (byte)(print_flags >> 2) & 1;
  printer_ctx.force_default = (byte)(print_flags >> 3) & 1;
  if ((print_flags & 0x10) != 0) {
    printer_ctx.indent = '\x02';
  }
  if ((print_flags & 0x20) != 0) {
    printer_ctx.indent = '\x02';
    printer_ctx.unquote = '\x01';
    printer_ctx.noenum = '\0';
  }
  bufsiz = strlen(json);
  iVar3 = flatcc_json_parser_table_as_root
                    (&builder,&parser_ctx,json,bufsiz,parse_flags,scope->identifier,scope->parser);
  pFVar1 = _stderr;
  if (iVar3 == expect_err) {
    iVar8 = 0;
    iVar3 = 0;
    if (expect_err == 0) {
      buf = flatcc_builder_finalize_aligned_buffer(&builder,&flatbuffer_size);
      iVar3 = flatcc_verify_table_as_root
                        (buf,CONCAT44(flatbuffer_size._4_4_,(uint)flatbuffer_size),scope->identifier
                         ,scope->verifier);
      pFVar1 = _stderr;
      if (iVar3 == 0) {
        flatcc_json_printer_table_as_root
                  (&printer_ctx,buf,CONCAT44(flatbuffer_size._4_4_,(uint)flatbuffer_size),
                   scope->identifier,scope->printer);
        pcVar4 = (char *)flatcc_json_printer_get_buffer(&printer_ctx,&buf_size);
        pcVar5 = local_280;
        if ((pcVar4 != (char *)0x0) && (iVar3 = strcmp(local_280,pcVar4), iVar3 == 0))
        goto LAB_00107399;
        fprintf(_stderr,"%d: json test: printed buffer not as expected, got:\n",(ulong)(uint)line);
        fprintf(_stderr,"%s\n",pcVar4);
        fwrite("expected:\n",10,1,_stderr);
        fprintf(_stderr,"%s\n",pcVar5);
      }
      else {
        pcVar5 = flatcc_verify_error_string(iVar3);
        fprintf(pFVar1,"%s:%d: buffer verification failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/json_test/test_json.c"
                ,(ulong)(uint)line,pcVar5);
      }
      pFVar1 = _stderr;
      iVar8 = -1;
      iVar3 = iVar8;
      if (buf != (void *)0x0) {
        uVar7 = (ulong)(uint)flatbuffer_size;
        fprintf(_stderr,"%s:\n","parsed buffer");
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          if ((uVar6 & 0xf) == 0) {
            if (uVar6 != 0) {
              fprintf(pFVar1,"  |%s|\n",local_278);
            }
            fprintf(pFVar1,"%08x ",uVar6 & 0xffffffff);
          }
          else if ((uVar6 & 7) == 0) {
            fputc(0x20,pFVar1);
          }
          fprintf(pFVar1," %02x",(ulong)*(byte *)((long)buf + uVar6));
          cVar2 = *(char *)((long)buf + uVar6);
          if ((byte)(cVar2 + 0x81U) < 0xa1) {
            cVar2 = '.';
          }
          local_278[(uint)uVar6 & 0xf] = cVar2;
          local_278[(uVar6 & 0xf) + 1] = '\0';
        }
        if (0xfffffff7 < ((uint)flatbuffer_size & 0xf) - 9) {
          fputc(0x20,pFVar1);
        }
        for (; (uVar7 & 0xf) != 0; uVar7 = (ulong)((int)uVar7 + 1)) {
          fwrite("   ",3,1,pFVar1);
        }
        fprintf(pFVar1,"  |%s|\n",local_278);
        goto LAB_00107399;
      }
    }
  }
  else {
    if (expect_err == 0) {
      pcVar5 = flatcc_json_parser_error_string(iVar3);
      pcVar4 = "%d: json test: parse failed: %s\n";
LAB_00107465:
      fprintf(pFVar1,pcVar4,(ulong)(uint)line,pcVar5);
    }
    else {
      if (iVar3 == 0) {
        pcVar5 = flatcc_json_parser_error_string(expect_err);
        pcVar4 = "%d: json test: parse successful, but expected to fail with: %s\n";
        goto LAB_00107465;
      }
      pcVar5 = flatcc_json_parser_error_string(iVar3);
      fprintf(pFVar1,"%d: json test: parse failed with: %s\n",(ulong)(uint)line,pcVar5);
      pFVar1 = _stderr;
      pcVar5 = flatcc_json_parser_error_string(expect_err);
      fprintf(pFVar1,"but expected to fail with: %s\n",pcVar5);
    }
    fprintf(_stderr,"%s\n",json);
    for (iVar3 = 0; iVar3 < parser_ctx.pos + -1; iVar3 = iVar3 + 1) {
      fputc(0x20,_stderr);
    }
    fwrite("^\n",2,1,_stderr);
    iVar3 = -1;
  }
  iVar8 = iVar3;
  buf = (void *)0x0;
LAB_00107399:
  flatcc_builder_aligned_free(buf);
  flatcc_builder_clear(&builder);
  flatcc_json_printer_clear(&printer_ctx);
  return iVar8;
}

Assistant:

int test_json(const struct test_scope *scope, char *json,
        char *expect, int expect_err,
        flatcc_json_parser_flags_t parse_flags, flatcc_json_printer_flags_t print_flags, int line)
{
    int ret = -1;
    int err;
    void *flatbuffer = 0;
    char *buf = 0;
    size_t flatbuffer_size, buf_size;
    flatcc_builder_t builder, *B;
    flatcc_json_parser_t parser_ctx;
    flatcc_json_printer_t printer_ctx;
    int i;

    B = &builder;
    flatcc_builder_init(B);
    flatcc_json_printer_init_dynamic_buffer(&printer_ctx, 0);
    flatcc_json_printer_set_flags(&printer_ctx, print_flags);
    err = flatcc_json_parser_table_as_root(B, &parser_ctx, json, strlen(json), parse_flags,
            scope->identifier, scope->parser);
    if (err != expect_err) {
        if (expect_err) {
            if (err) {
                fprintf(stderr, "%d: json test: parse failed with: %s\n",
                        line, flatcc_json_parser_error_string(err));
                fprintf(stderr, "but expected to fail with: %s\n",
                        flatcc_json_parser_error_string(expect_err));
                fprintf(stderr, "%s\n", json);
            } else {
                fprintf(stderr, "%d: json test: parse successful, but expected to fail with: %s\n",
                        line, flatcc_json_parser_error_string(expect_err));
                fprintf(stderr, "%s\n", json);
            }
        } else {
            fprintf(stderr, "%d: json test: parse failed: %s\n", line, flatcc_json_parser_error_string(err));
            fprintf(stderr, "%s\n", json);
        }
        for (i = 0; i < parser_ctx.pos - 1; ++i) {
            fprintf(stderr, " ");
        }
        fprintf(stderr, "^\n");
        goto failed;
    }
    if (expect_err) {
        ret = 0;
        goto done;
    }
    flatbuffer = flatcc_builder_finalize_aligned_buffer(B, &flatbuffer_size);
    if ((ret = flatcc_verify_table_as_root(flatbuffer, flatbuffer_size, scope->identifier, scope->verifier))) {
        fprintf(stderr, "%s:%d: buffer verification failed: %s\n",
                __FILE__, line, flatcc_verify_error_string(ret));
        goto failed;
    }

    flatcc_json_printer_table_as_root(&printer_ctx, flatbuffer, flatbuffer_size, scope->identifier, scope->printer);
    buf = flatcc_json_printer_get_buffer(&printer_ctx, &buf_size);
    if (!buf || strcmp(expect, buf)) {
        fprintf(stderr, "%d: json test: printed buffer not as expected, got:\n", line);
        fprintf(stderr, "%s\n", buf);
        fprintf(stderr, "expected:\n");
        fprintf(stderr, "%s\n", expect);
        goto failed;
    }
    ret = 0;

done:
    flatcc_builder_aligned_free(flatbuffer);
    flatcc_builder_clear(B);
    flatcc_json_printer_clear(&printer_ctx);
    return ret;

failed:
    if (flatbuffer) {
        hexdump("parsed buffer", flatbuffer, flatbuffer_size, stderr);
    }
    ret = -1;
    goto done;
}